

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O1

void __thiscall irr::CIrrDeviceStub::~CIrrDeviceStub(CIrrDeviceStub *this,void **vtt)

{
  int *piVar1;
  _func_int **pp_Var2;
  long *plVar3;
  long lVar4;
  IContextManager *pIVar5;
  _func_int *p_Var6;
  IFileSystem *pIVar7;
  ISceneManager *pIVar8;
  ICursorControl *pIVar9;
  IOSOperator *pIVar10;
  ITimer *pIVar11;
  CLogger *pCVar12;
  pointer pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IrrlichtDevice)._vptr_IrrlichtDevice = pp_Var2;
  *(void **)((long)&(this->super_IrrlichtDevice)._vptr_IrrlichtDevice + (long)pp_Var2[-3]) = vtt[3];
  plVar3 = *(long **)&(this->super_IrrlichtDevice).field_0x10;
  if (plVar3 != (long *)0x0) {
    lVar4 = *(long *)(*plVar3 + -0x18);
    piVar1 = (int *)((long)plVar3 + lVar4 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)plVar3 + lVar4) + 8))();
    }
  }
  plVar3 = *(long **)&(this->super_IrrlichtDevice).field_0x18;
  if (plVar3 != (long *)0x0) {
    lVar4 = *(long *)(*plVar3 + -0x18);
    piVar1 = (int *)((long)plVar3 + lVar4 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)plVar3 + lVar4) + 8))();
    }
  }
  plVar3 = *(long **)&(this->super_IrrlichtDevice).field_0x8;
  if (plVar3 != (long *)0x0) {
    lVar4 = *(long *)(*plVar3 + -0x18);
    piVar1 = (int *)((long)plVar3 + lVar4 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)plVar3 + lVar4) + 8))();
    }
  }
  pIVar5 = this->ContextManager;
  if (pIVar5 != (IContextManager *)0x0) {
    p_Var6 = pIVar5->_vptr_IContextManager[-3];
    piVar1 = (int *)(&pIVar5->field_0x10 + (long)p_Var6);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar5->_vptr_IContextManager + (long)p_Var6) + 8))();
    }
  }
  pIVar7 = this->FileSystem;
  if (pIVar7 != (IFileSystem *)0x0) {
    p_Var6 = pIVar7->_vptr_IFileSystem[-3];
    piVar1 = (int *)(&pIVar7->field_0x10 + (long)p_Var6);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar7->_vptr_IFileSystem + (long)p_Var6) + 8))();
    }
  }
  pIVar8 = this->InputReceivingSceneManager;
  if (pIVar8 != (ISceneManager *)0x0) {
    p_Var6 = pIVar8->_vptr_ISceneManager[-3];
    piVar1 = (int *)(&pIVar8->field_0x10 + (long)p_Var6);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar8->_vptr_ISceneManager + (long)p_Var6) + 8))();
    }
  }
  pIVar9 = this->CursorControl;
  if (pIVar9 != (ICursorControl *)0x0) {
    p_Var6 = pIVar9->_vptr_ICursorControl[-3];
    piVar1 = (int *)(&pIVar9->field_0x10 + (long)p_Var6);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar9->_vptr_ICursorControl + (long)p_Var6) + 8))();
    }
  }
  pIVar10 = this->Operator;
  if (pIVar10 != (IOSOperator *)0x0) {
    p_Var6 = pIVar10->_vptr_IOSOperator[-3];
    piVar1 = (int *)(&pIVar10->field_0x10 + (long)p_Var6);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar10->_vptr_IOSOperator + (long)p_Var6) + 8))();
    }
  }
  this->CursorControl = (ICursorControl *)0x0;
  pIVar11 = this->Timer;
  if (pIVar11 != (ITimer *)0x0) {
    p_Var6 = pIVar11->_vptr_ITimer[-3];
    piVar1 = (int *)(&pIVar11->field_0x10 + (long)p_Var6);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar11->_vptr_ITimer + (long)p_Var6) + 8))();
    }
  }
  pCVar12 = this->Logger;
  p_Var6 = (pCVar12->super_ILogger)._vptr_ILogger[-3];
  piVar1 = (int *)(&(pCVar12->super_ILogger).field_0x10 + (long)p_Var6);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)((long)&(pCVar12->super_ILogger)._vptr_ILogger + (long)p_Var6) + 8))();
    os::Printer::Logger = 0;
  }
  pcVar13 = (this->CreationParams).OGLES2ShaderPath.str._M_dataplus._M_p;
  paVar14 = &(this->CreationParams).OGLES2ShaderPath.str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar13 != paVar14) {
    operator_delete(pcVar13,paVar14->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

CIrrDeviceStub::~CIrrDeviceStub()
{
	if (GUIEnvironment)
		GUIEnvironment->drop();

	if (SceneManager)
		SceneManager->drop();

	if (VideoDriver)
		VideoDriver->drop();

	if (ContextManager)
		ContextManager->drop();

	if (FileSystem)
		FileSystem->drop();

	if (InputReceivingSceneManager)
		InputReceivingSceneManager->drop();

	if (CursorControl)
		CursorControl->drop();

	if (Operator)
		Operator->drop();

	CursorControl = 0;

	if (Timer)
		Timer->drop();

	if (Logger->drop())
		os::Printer::Logger = 0;
}